

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionFromMatrix(Matrix mat)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Quaternion QVar5;
  float in_stack_00000008;
  float in_stack_0000000c;
  
  if ((in_stack_00000008 <= mat.m12) || (in_stack_00000008 <= mat.m2)) {
    if (mat.m12 <= mat.m2) {
      fVar2 = ((mat.m2 + 1.0) - in_stack_00000008) - mat.m12;
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      fVar2 = fVar2 + fVar2;
      uVar1 = CONCAT44((mat.m1 + mat.m13) / fVar2,(mat.m9 + mat.m0) / fVar2);
      fVar3 = fVar2 * 0.25;
      fVar4 = in_stack_0000000c - mat.m8;
    }
    else {
      fVar2 = ((mat.m12 + 1.0) - in_stack_00000008) - mat.m2;
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      fVar2 = fVar2 + fVar2;
      uVar1 = CONCAT44(fVar2 * 0.25,(in_stack_0000000c + mat.m8) / fVar2);
      fVar3 = (mat.m1 + mat.m13) / fVar2;
      fVar4 = mat.m9 - mat.m0;
    }
  }
  else {
    fVar2 = ((in_stack_00000008 + 1.0) - mat.m12) - mat.m2;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar2 = fVar2 + fVar2;
    uVar1 = CONCAT44((in_stack_0000000c + mat.m8) / fVar2,fVar2 * 0.25);
    fVar3 = (mat.m9 + mat.m0) / fVar2;
    fVar4 = mat.m1 - mat.m13;
  }
  QVar5.w = fVar4 / fVar2;
  QVar5.z = fVar3;
  QVar5.x = (float)(int)uVar1;
  QVar5.y = (float)(int)((ulong)uVar1 >> 0x20);
  return QVar5;
}

Assistant:

RMDEF Quaternion QuaternionFromMatrix(Matrix mat)
{
    Quaternion result = { 0 };

    if ((mat.m0 > mat.m5) && (mat.m0 > mat.m10))
    {
        float s = sqrtf(1.0f + mat.m0 - mat.m5 - mat.m10)*2;

        result.x = 0.25f*s;
        result.y = (mat.m4 + mat.m1)/s;
        result.z = (mat.m2 + mat.m8)/s;
        result.w = (mat.m9 - mat.m6)/s;
    }
    else if (mat.m5 > mat.m10)
    {
        float s = sqrtf(1.0f + mat.m5 - mat.m0 - mat.m10)*2;
        result.x = (mat.m4 + mat.m1)/s;
        result.y = 0.25f*s;
        result.z = (mat.m9 + mat.m6)/s;
        result.w = (mat.m2 - mat.m8)/s;
    }
    else
    {
        float s  = sqrtf(1.0f + mat.m10 - mat.m0 - mat.m5)*2;
        result.x = (mat.m2 + mat.m8)/s;
        result.y = (mat.m9 + mat.m6)/s;
        result.z = 0.25f*s;
        result.w = (mat.m4 - mat.m1)/s;
    }

    return result;
}